

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O0

StackNode *
stack_node_new(StackNode *previous_node,Subtree subtree,_Bool is_pending,TSStateId state,
              StackNodeArray *pool)

{
  StackNode *pSVar1;
  uint32_t uVar2;
  int32_t iVar3;
  uint uVar4;
  Length LVar5;
  StackNode *local_1b0;
  undefined8 local_1a8;
  uint32_t local_1a0;
  undefined8 local_188;
  uint32_t local_180;
  undefined7 uStack_11f;
  TSStateId local_118 [106];
  undefined4 local_44;
  StackNode *local_30;
  StackNode *node;
  StackNodeArray *pool_local;
  TSStateId state_local;
  StackNode *pSStack_18;
  _Bool is_pending_local;
  StackNode *previous_node_local;
  Subtree subtree_local;
  
  node = (StackNode *)pool;
  pool_local._4_2_ = state;
  pool_local._7_1_ = is_pending;
  pSStack_18 = previous_node;
  previous_node_local = (StackNode *)subtree;
  if (pool->size == 0) {
    local_1b0 = (StackNode *)ts_malloc(0xe8);
  }
  else {
    uVar4 = pool->size - 1;
    pool->size = uVar4;
    local_1b0 = pool->contents[uVar4];
  }
  local_30 = local_1b0;
  memset(local_118,0,0xe8);
  local_118[0] = pool_local._4_2_;
  local_44 = 1;
  memcpy(local_1b0,local_118,0xe8);
  pSVar1 = local_30;
  if (pSStack_18 == (StackNode *)0x0) {
    LVar5 = length_zero();
    local_1a8 = LVar5._0_8_;
    local_1a0 = LVar5.extent.column;
    (pSVar1->position).bytes = (undefined4)local_1a8;
    (pSVar1->position).extent.row = local_1a8._4_4_;
    (pSVar1->position).extent.column = local_1a0;
    local_30->error_cost = 0;
  }
  else {
    local_30->link_count = 1;
    local_30->links[0].node = pSStack_18;
    local_30->links[0].subtree.ptr = (SubtreeHeapData *)previous_node_local;
    *(ulong *)&local_30->links[0].is_pending =
         CONCAT71(uStack_11f,pool_local._7_1_) & 0xffffffffffffff01;
    uVar2 = (pSStack_18->position).extent.row;
    (pSVar1->position).bytes = (pSStack_18->position).bytes;
    (pSVar1->position).extent.row = uVar2;
    (local_30->position).extent.column = (pSStack_18->position).extent.column;
    local_30->error_cost = pSStack_18->error_cost;
    local_30->dynamic_precedence = pSStack_18->dynamic_precedence;
    local_30->node_count = pSStack_18->node_count;
    if (previous_node_local != (StackNode *)0x0) {
      uVar2 = ts_subtree_error_cost((Subtree)previous_node_local);
      pSVar1 = local_30;
      local_30->error_cost = local_30->error_cost + uVar2;
      LVar5 = ts_subtree_total_size((Subtree)previous_node_local);
      LVar5 = length_add(pSVar1->position,LVar5);
      local_188 = LVar5._0_8_;
      local_180 = LVar5.extent.column;
      (pSVar1->position).bytes = (undefined4)local_188;
      (pSVar1->position).extent.row = local_188._4_4_;
      (pSVar1->position).extent.column = local_180;
      uVar2 = ts_subtree_node_count((Subtree)previous_node_local);
      local_30->node_count = uVar2 + local_30->node_count;
      iVar3 = ts_subtree_dynamic_precedence((Subtree)previous_node_local);
      local_30->dynamic_precedence = iVar3 + local_30->dynamic_precedence;
    }
  }
  return local_30;
}

Assistant:

static StackNode *stack_node_new(StackNode *previous_node, Subtree subtree,
                                 bool is_pending, TSStateId state, StackNodeArray *pool) {
  StackNode *node = pool->size > 0 ?
    array_pop(pool) :
    ts_malloc(sizeof(StackNode));
  *node = (StackNode){.ref_count = 1, .link_count = 0, .state = state};

  if (previous_node) {
    node->link_count = 1;
    node->links[0] = (StackLink){
      .node = previous_node,
      .subtree = subtree,
      .is_pending = is_pending,
    };

    node->position = previous_node->position;
    node->error_cost = previous_node->error_cost;
    node->dynamic_precedence = previous_node->dynamic_precedence;
    node->node_count = previous_node->node_count;

    if (subtree.ptr) {
      node->error_cost += ts_subtree_error_cost(subtree);
      node->position = length_add(node->position, ts_subtree_total_size(subtree));
      node->node_count += ts_subtree_node_count(subtree);
      node->dynamic_precedence += ts_subtree_dynamic_precedence(subtree);
    }
  } else {
    node->position = length_zero();
    node->error_cost = 0;
  }

  return node;
}